

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InfoLogCase::iterate(InfoLogCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar7;
  StateQueryMemoryWriteGuard<int> logLen;
  string buf;
  ScopedLogSection section;
  CallLogWrapper gl;
  int written;
  ScopedLogSection section_2;
  ResultCollector result;
  ShaderProgram frgProgram;
  ShaderProgram vtxProgram;
  string local_320;
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  ProgramPipeline local_2d8;
  undefined1 local_2c8 [28];
  GLsizei local_2ac;
  ScopedLogSection local_2a8;
  undefined1 local_2a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  bool local_1d8;
  undefined1 local_1d0 [176];
  undefined1 local_120 [16];
  pointer local_110;
  bool local_108;
  ShaderProgram local_100;
  
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1d0,0,0xac);
  local_120._0_8_ = (pointer)0x0;
  local_120._8_8_ = (pointer)0x0;
  local_110 = (pointer)0x0;
  local_108 = true;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,"");
  local_2a0._0_4_ = QP_TEST_RESULT_PASS;
  local_2a0._8_8_ = &local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2a0 + 8),local_300._0_8_,(char *)(local_300._0_8_ + local_300._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)(uint)local_2a0._0_4_ * 0x18),(value_type *)(local_2a0 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_1d0 + 0x90));
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_2a0,0,0xac);
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8 = true;
  paVar1 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "#version 310 es\nin mediump vec2 v_colorB;\nin mediump vec2 v_colorC;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_colorB.xxyy + v_colorC.yyxy;\n}\n"
             ,"");
  local_300._0_4_ = 1;
  local_300._8_8_ = local_2f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_300 + 8),local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p +
             CONCAT44(local_320._M_string_length._4_4_,(undefined4)local_320._M_string_length));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + (local_300._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_300 + 8));
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar2,(ProgramSources *)local_2a0);
  if ((char *)local_300._8_8_ != local_2f0._M_local_buf + 8) {
    operator_delete((void *)local_300._8_8_,local_2f0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_210);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_2c8,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300," // ERROR: ","");
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_2a0,pTVar3,(string *)local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"VtxProg","");
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Vertex program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2d8,pTVar3,(string *)local_300,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&local_100
                 );
  tcu::TestLog::endSection((TestLog *)local_2d8.m_gl);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"FrgProg","");
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Fragment program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2d8,pTVar3,(string *)local_300,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_1d0);
  tcu::TestLog::endSection((TestLog *)local_2d8.m_gl);
  if ((local_100.m_program.m_info.linkOk != true) || (local_110._0_1_ == false)) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_300._0_8_ = &local_2f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_300,"failed to build program","");
    tcu::TestError::TestError(this_00,(string *)local_300);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2c8[0x10] = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"Initial","");
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection(&local_2a8,pTVar3,(string *)local_300,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  glu::ProgramPipeline::ProgramPipeline(&local_2d8,((this->super_TestCase).m_context)->m_renderCtx);
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct((ulong)local_300,'\x03');
  local_2ac = -1;
  deqp::gls::StateQueryUtil::verifyStatePipelineInteger
            ((ResultCollector *)local_2a0,(CallLogWrapper *)local_2c8,local_2d8.m_pipeline,0x8b84,0,
             QUERY_PIPELINE_INTEGER);
  glu::CallLogWrapper::glGetProgramPipelineInfoLog
            ((CallLogWrapper *)local_2c8,local_2d8.m_pipeline,2,&local_2ac,(GLchar *)local_300._0_8_
            );
  GVar6 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2c8);
  glu::checkError(GVar6,"query log",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x152);
  if (local_2ac == 0) {
    if (*(char *)local_300._0_8_ == '\0') {
      if ((*(char *)(local_300._0_8_ + 1) == 'X') && (*(char *)(local_300._0_8_ + 2) == 'X'))
      goto LAB_01517ac1;
      local_320._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_320,"buffer after returned length modified","");
      tcu::ResultCollector::fail((ResultCollector *)local_2a0,&local_320);
    }
    else {
      local_320._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_320,"log was not 0-sized null-terminated string","");
      tcu::ResultCollector::fail((ResultCollector *)local_2a0,&local_320);
    }
  }
  else if (local_2ac == -1) {
    local_320._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_320,"\'length\' was not written to","");
    tcu::ResultCollector::fail((ResultCollector *)local_2a0,&local_320);
  }
  else {
    local_320._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"\'length\' was not 0","");
    tcu::ResultCollector::fail((ResultCollector *)local_2a0,&local_320);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
LAB_01517ac1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  glu::ProgramPipeline::~ProgramPipeline(&local_2d8);
  tcu::TestLog::endSection(local_2a8.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_300._0_8_ = &local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"ValidationFail","");
  local_320._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Failed validation","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2d8,pTVar3,(string *)local_300,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar1) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._0_8_ != &local_2f0) {
    operator_delete((void *)local_300._0_8_,local_2f0._M_allocated_capacity + 1);
  }
  glu::ProgramPipeline::ProgramPipeline
            ((ProgramPipeline *)local_300,((this->super_TestCase).m_context)->m_renderCtx);
  local_320._M_dataplus._M_p = (pointer)0xdededededededede;
  local_320._M_string_length._0_4_ = 0xdededede;
  glu::CallLogWrapper::glBindProgramPipeline((CallLogWrapper *)local_2c8,local_300._8_4_);
  glu::CallLogWrapper::glUseProgramStages
            ((CallLogWrapper *)local_2c8,local_300._8_4_,1,local_100.m_program.m_program);
  glu::CallLogWrapper::glUseProgramStages
            ((CallLogWrapper *)local_2c8,local_300._8_4_,2,local_1d0._152_4_);
  GVar6 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2c8);
  glu::checkError(GVar6,"gen pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x166);
  glu::CallLogWrapper::glBindProgramPipeline((CallLogWrapper *)local_2c8,0);
  GVar6 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2c8);
  glu::checkError(GVar6,"unbind pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x169);
  glu::CallLogWrapper::glValidateProgramPipeline((CallLogWrapper *)local_2c8,local_300._8_4_);
  GVar6 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2c8);
  glu::checkError(GVar6,"gen pipeline",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x16b);
  glu::CallLogWrapper::glGetProgramPipelineiv
            ((CallLogWrapper *)local_2c8,local_300._8_4_,0x8b84,
             (GLint *)((long)&local_320._M_dataplus._M_p + 4));
  GVar6 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_2c8);
  glu::checkError(GVar6,"get INFO_LOG_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                  ,0x16e);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&local_320,(ResultCollector *)local_2a0);
  if (bVar4) {
    verifyInfoLogQuery((Functional *)local_2a0,(ResultCollector *)local_2c8,
                       (CallLogWrapper *)((ulong)local_320._M_dataplus._M_p >> 0x20),local_300._8_4_
                       ,0x18fd1c6,0,"glGetProgramPipelineInfoLog");
  }
  glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)local_300);
  tcu::TestLog::endSection((TestLog *)local_2d8.m_gl);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_2a0,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_p != local_260) {
    operator_delete(local_270._M_p,(ulong)(local_260[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_2c8);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

InfoLogCase::IterateResult InfoLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	static const char* const s_incompatibleFragmentSource = "#version 310 es\n"
															"in mediump vec2 v_colorB;\n"
															"in mediump vec2 v_colorC;\n"
															"layout(location=0) out highp vec4 o_color;\n"
															"void main()\n"
															"{\n"
															"	o_color = v_colorB.xxyy + v_colorC.yyxy;\n"
															"}\n";

	glu::ShaderProgram		vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	glu::ShaderProgram		frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_incompatibleFragmentSource));
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "Initial", "Initial");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());
		std::string					buf			(3, 'X');
		int							written		= -1;

		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_INFO_LOG_LENGTH, 0, QUERY_PIPELINE_INTEGER);

		gl.glGetProgramPipelineInfoLog(pipeline.getPipeline(), 2, &written, &buf[0]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query log");

		if (written == -1)
			result.fail("'length' was not written to");
		else if (written != 0)
			result.fail("'length' was not 0");
		else if (buf[0] != '\0')
			result.fail("log was not 0-sized null-terminated string");
		else if (buf[1] != 'X' || buf[2] != 'X')
			result.fail("buffer after returned length modified");
	}

	{
		const tcu::ScopedLogSection				superSection	(m_testCtx.getLog(), "ValidationFail", "Failed validation");
		glu::ProgramPipeline					pipeline		(m_context.getRenderContext());
		StateQueryMemoryWriteGuard<glw::GLint>	logLen;

		gl.glBindProgramPipeline(pipeline.getPipeline());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
		gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glBindProgramPipeline(0);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");
		gl.glValidateProgramPipeline(pipeline.getPipeline());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");

		gl.glGetProgramPipelineiv(pipeline.getPipeline(), GL_INFO_LOG_LENGTH, &logLen);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "get INFO_LOG_LENGTH");

		if (logLen.verifyValidity(result))
			verifyInfoLogQuery(result, gl, logLen, pipeline.getPipeline(), &glu::CallLogWrapper::glGetProgramPipelineInfoLog, "glGetProgramPipelineInfoLog");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}